

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::TableViewCellLayout::minimumSize(TableViewCellLayout *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int extraout_var;
  int extraout_EDX;
  int extraout_var_00;
  int iVar5;
  int iVar6;
  QSize QVar7;
  
  uVar1 = (**(code **)(*(long *)this->imageLabel + 0x78))();
  uVar2 = (**(code **)(*(long *)this->textLabel + 0x78))();
  uVar3 = (**(code **)(*(long *)this->detailedTextLabel + 0x78))();
  uVar4 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar4 = uVar2;
  }
  iVar6 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
  iVar5 = (int)((ulong)uVar1 >> 0x20);
  if (iVar6 <= iVar5) {
    iVar6 = iVar5;
  }
  uVar2 = (**(code **)(*(long *)this->accessoryWidget + 0x78))();
  iVar5 = (int)((ulong)uVar2 >> 0x20);
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = QLayout::contentsMargins();
  QLayout::contentsMargins();
  QVar7.wd = extraout_EDX + iVar6 + (int)uVar2 + (int)uVar1 + (int)uVar4;
  QLayout::contentsMargins();
  QLayout::contentsMargins();
  QVar7.ht = extraout_var + extraout_var_00 + iVar5;
  return QVar7;
}

Assistant:

QSize
TableViewCellLayout::minimumSize() const
{
	const QSize imageSize = imageLabel->minimumSizeHint();

	int width = imageSize.width();
	int height = imageSize.height();

	const QSize textSize = textLabel->minimumSizeHint();
	const QSize detailedTextSize = detailedTextLabel->minimumSizeHint();

	width += qMax( textSize.width(), detailedTextSize.width() );
	height = qMax( height,
		textSize.height() + detailedTextSize.height() );

	const QSize accessorySize = accessoryWidget->minimumSizeHint();

	width += accessorySize.width();
	height = qMax( height, accessorySize.height() );

	return QSize( width + contentsMargins().left() + contentsMargins().right(),
		height + contentsMargins().top() + contentsMargins().bottom() );
}